

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O0

void * __thiscall
MemPlumberInternal::allocateMemory(MemPlumberInternal *this,size_t size,char *file,int line)

{
  bool bVar1;
  new_ptr_list_t *__s;
  ulong uVar2;
  MemPlumberInternal *local_68;
  new_ptr_list_t **hashtable;
  size_t hashIndex;
  void *actualPointer;
  new_ptr_list_t *pointerMetaDataRecord;
  size_t totalSizeToAllocate;
  int line_local;
  char *file_local;
  size_t size_local;
  MemPlumberInternal *this_local;
  
  if ((this->m_ProgramStarted == 0) || ((this->m_Started & 1U) != 0)) {
    __s = (new_ptr_list_t *)malloc(size + 0x78);
    memset(__s,0,0x78);
    if (__s == (new_ptr_list_t *)0x0) {
      this_local = (MemPlumberInternal *)0x0;
    }
    else {
      this_local = (MemPlumberInternal *)(__s + 1);
      uVar2 = (ulong)this_local >> 8 & 0x3fff;
      local_68 = this;
      if (this->m_ProgramStarted == 0) {
        local_68 = (MemPlumberInternal *)this->m_StaticPointerListHashtable;
      }
      __s->next = local_68->m_PointerListHashtable[uVar2];
      __s->line = line;
      __s->size = size;
      strncpy(__s->file,file,99);
      __s->file[99] = '\0';
      local_68->m_PointerListHashtable[uVar2] = __s;
      bVar1 = isVerbose(this);
      if (bVar1) {
        if (this->m_ProgramStarted == 0) {
          fprintf((FILE *)this->m_Dumper,"Allocate static variable: %d[bytes] in 0x%p in %s:%d\n",
                  size & 0xffffffff,this_local,file,(ulong)(uint)line);
        }
        else {
          fprintf((FILE *)this->m_Dumper,"Allocate: %d[bytes] in 0x%p in %s:%d\n",size & 0xffffffff,
                  this_local,file,(ulong)(uint)line);
        }
      }
    }
  }
  else {
    bVar1 = isVerbose(this);
    if (bVar1) {
      fprintf((FILE *)this->m_Dumper,"Request for memory allocation before program started\n");
    }
    this_local = (MemPlumberInternal *)malloc(size);
  }
  return this_local;
}

Assistant:

void* allocateMemory(std::size_t size, const char* file, int line) {

        // if not started, allocate memory and exit
        if (m_ProgramStarted != 0 && !m_Started) {
            if (isVerbose()) {
                fprintf(m_Dumper, "Request for memory allocation before program started\n");
            }
            return malloc(size);
        }

        // total memory to allocated is the requested size + metadata size
        size_t totalSizeToAllocate = size + sizeof(new_ptr_list_t);

        // allocated memory
        new_ptr_list_t* pointerMetaDataRecord = (new_ptr_list_t*)malloc(totalSizeToAllocate);
        memset(pointerMetaDataRecord, 0, sizeof(new_ptr_list_t));

        // if cannot allocate, return NULL
        if (pointerMetaDataRecord == NULL)
            return pointerMetaDataRecord;
        
        // calculate the actual pointer to provide to the user
        void* actualPointer = (char*)pointerMetaDataRecord + sizeof(new_ptr_list_t);

        // find the hash index for this pointer
        size_t hashIndex = MEMPLUMBER_HASH(actualPointer);

        new_ptr_list_t** hashtable = (m_ProgramStarted == 0 ? m_StaticPointerListHashtable : m_PointerListHashtable);

        // chain this metadata to the linked list of the specific bucket 
        pointerMetaDataRecord->next = hashtable[hashIndex];

        // fill in the metadata
        pointerMetaDataRecord->line = line;
        pointerMetaDataRecord->size = size;
        strncpy(pointerMetaDataRecord->file, file, MEMPLUMBER_FILENAME_LEN - 1);
		pointerMetaDataRecord->file[MEMPLUMBER_FILENAME_LEN - 1] = '\0';

        // put this metadata in the head of the list
        hashtable[hashIndex] = pointerMetaDataRecord;

        if (isVerbose()) {
            if (m_ProgramStarted == 0) {
                fprintf(m_Dumper, "Allocate static variable: %d[bytes] in 0x%p in %s:%d\n", (int)size, actualPointer, file, line);
            } else {
                fprintf(m_Dumper, "Allocate: %d[bytes] in 0x%p in %s:%d\n", (int)size, actualPointer, file, line);
            }
        }

        return actualPointer;
    }